

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.cpp
# Opt level: O0

bool lzham::prefix_coding::generate_codes(uint num_syms,uint8 *pCodesizes,uint16 *pCodes)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  uint c_1;
  uint i_3;
  uint i_2;
  uint t;
  uint i_1;
  uint next_code [17];
  uint code;
  uint c;
  uint i;
  uint num_codes [17];
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int local_b8 [17];
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68 [20];
  long local_18;
  long local_10;
  uint local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  utils::zero_object<unsigned_int[17]>((uint (*) [17])0x1264e8);
  for (local_6c = 0; local_6c < local_8; local_6c = local_6c + 1) {
    local_70 = (uint)*(byte *)(local_10 + (ulong)local_6c);
    local_68[local_70] = local_68[local_70] + 1;
  }
  local_74 = 0;
  local_b8[0] = 0;
  for (local_bc = 1; local_bc < 0x11; local_bc = local_bc + 1) {
    local_b8[local_bc] = local_74;
    local_74 = (local_74 + local_68[local_bc]) * 2;
  }
  if (local_74 != 0x20000) {
    local_c0 = 0;
    for (local_c4 = 1; local_c4 < 0x11; local_c4 = local_c4 + 1) {
      local_c0 = local_68[local_c4] + local_c0;
      if (1 < local_c0) {
        return false;
      }
    }
  }
  for (local_c8 = 0; local_c8 < local_8; local_c8 = local_c8 + 1) {
    iVar1 = local_b8[*(byte *)(local_10 + (ulong)local_c8)];
    local_b8[*(byte *)(local_10 + (ulong)local_c8)] = iVar1 + 1;
    *(short *)(local_18 + (ulong)local_c8 * 2) = (short)iVar1;
  }
  return true;
}

Assistant:

bool generate_codes(uint num_syms, const uint8* pCodesizes, uint16* pCodes)
      {
         uint num_codes[cMaxExpectedHuffCodeSize + 1];
         utils::zero_object(num_codes);

         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            LZHAM_ASSERT(c <= cMaxExpectedHuffCodeSize);
            num_codes[c]++;
         }

         uint code = 0;

         uint next_code[cMaxExpectedHuffCodeSize + 1];
         next_code[0] = 0;
         
         for (uint i = 1; i <= cMaxExpectedHuffCodeSize; i++)
         {
            next_code[i] = code;
            
            code = (code + num_codes[i]) << 1;
         }

         if (code != (1 << (cMaxExpectedHuffCodeSize + 1)))
         {
            uint t = 0;
            for (uint i = 1; i <= cMaxExpectedHuffCodeSize; i++)
            {
               t += num_codes[i];
               if (t > 1)
               {
                  LZHAM_LOG_ERROR(3003);
                  return false;
               }
            }
         }

         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            
            LZHAM_ASSERT(!c || (next_code[c] <= cUINT16_MAX));
            
            pCodes[i] = static_cast<uint16>(next_code[c]++);
            
            LZHAM_ASSERT(!c || (math::total_bits(pCodes[i]) <= pCodesizes[i]));
         }
         
         return true;
      }